

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::ForStatement::dump_abi_cxx11_
          (string *__return_storage_ptr__,ForStatement *this,int level)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  pointer pBVar4;
  allocator local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268 [39];
  allocator local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [380];
  int local_1c;
  ForStatement *pFStack_18;
  int level_local;
  ForStatement *this_local;
  
  local_1c = level;
  pFStack_18 = this;
  this_local = (ForStatement *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  uVar2 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,uVar2,'\t',&local_1e9);
  std::operator+(&local_1c8,&local_1e8,"ForStatement {");
  poVar3 = std::operator<<(local_198,(string *)&local_1c8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,(long)iVar1,'\t',&local_241);
  std::operator+(&local_220,&local_240,"Iterator: ");
  poVar3 = std::operator<<(local_198,(string *)&local_220);
  poVar3 = std::operator<<(poVar3,(string *)&this->iterator_name);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  pBVar4 = std::
           unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ::operator->(&this->body);
  (*(pBVar4->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[3])
            (local_268,pBVar4,(ulong)(local_1c + 1));
  poVar3 = std::operator<<(local_198,local_268);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_268);
  uVar2 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,uVar2,'\t',&local_2a9);
  std::operator+(&local_288,&local_2a8,"}");
  poVar3 = std::operator<<(local_198,(string *)&local_288);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::ForStatement::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "ForStatement {" << std::endl;
    s << std::string(level+1, '\t') + "Iterator: " << iterator_name << std::endl;
    s << this->body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}